

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hh
# Opt level: O2

string * __thiscall
OB::Color::rgb_to_hex_abi_cxx11_(string *__return_storage_ptr__,Color *this,RGB rgb)

{
  ostream *poVar1;
  ostringstream local_200 [8];
  ostringstream os;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::ostringstream::ostringstream(local_200);
  poVar1 = std::operator<<((ostream *)local_200,"#");
  hex_encode_abi_cxx11_(&local_88,this,(char)(int)rgb.r);
  poVar1 = std::operator<<(poVar1,(string *)&local_88);
  hex_encode_abi_cxx11_(&local_68,this,(char)(int)rgb.g);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  hex_encode_abi_cxx11_(&local_48,this,(char)(int)rgb.b);
  std::operator<<(poVar1,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_200);
  return __return_storage_ptr__;
}

Assistant:

std::string rgb_to_hex(RGB rgb) const
  {
    std::ostringstream os; os
    << "#"
    << hex_encode(static_cast<char>(rgb.r))
    << hex_encode(static_cast<char>(rgb.g))
    << hex_encode(static_cast<char>(rgb.b));

    return os.str();
  }